

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_assert_normalized(poly *x)

{
  poly *x_local;
  
  if ((x->field_0).v[0x2bd] != 0) {
    __assert_fail("x->v[N] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                  ,0x372,"void poly_assert_normalized(const struct poly *)");
  }
  if ((x->field_0).v[0x2be] == 0) {
    if ((x->field_0).v[0x2bf] == 0) {
      return;
    }
    __assert_fail("x->v[N + 2] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                  ,0x374,"void poly_assert_normalized(const struct poly *)");
  }
  __assert_fail("x->v[N + 1] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                ,0x373,"void poly_assert_normalized(const struct poly *)");
}

Assistant:

static void poly_assert_normalized(const struct poly *x) {
  assert(x->v[N] == 0);
  assert(x->v[N + 1] == 0);
  assert(x->v[N + 2] == 0);
}